

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall
binlog::PrettyPrinter::printEventMessage(PrettyPrinter *this,OstreamBuffer *out,Event *event)

{
  long lVar1;
  string_view tag_00;
  OstreamBuffer *pOVar2;
  char *pcVar3;
  long *in_RDX;
  OstreamBuffer *in_RSI;
  PrettyPrinter *in_RDI;
  string_view sVar4;
  string_view tag;
  char c;
  size_t i;
  string *fmt;
  ToStringVisitor visitor;
  Range args;
  string_view tags;
  undefined7 in_stack_ffffffffffffff58;
  char in_stack_ffffffffffffff5f;
  string_view *in_stack_ffffffffffffff60;
  OstreamBuffer *this_00;
  ToStringVisitor *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff90;
  char cVar5;
  OstreamBuffer *local_68;
  ToStringVisitor local_58;
  long local_38;
  long local_30;
  long *local_18;
  OstreamBuffer *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  mserialize::string_view::string_view
            (in_stack_ffffffffffffff60,
             (string *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  local_38 = local_18[2];
  local_30 = local_18[3];
  ToStringVisitor::ToStringVisitor(&local_58,local_10,in_RDI);
  lVar1 = *local_18;
  local_68 = (OstreamBuffer *)0x0;
  do {
    this_00 = local_68;
    pOVar2 = (OstreamBuffer *)std::__cxx11::string::size();
    if (pOVar2 <= this_00) {
      return;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[](lVar1 + 0x78U);
    cVar5 = *pcVar3;
    if (cVar5 == '{') {
      pcVar3 = (char *)std::__cxx11::string::operator[](lVar1 + 0x78U);
      if (*pcVar3 != '}') goto LAB_0027380c;
      sVar4 = mserialize::detail::tag_pop((string_view *)in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff70 = (ToStringVisitor *)sVar4._ptr;
      tag_00._len._0_7_ = in_stack_ffffffffffffff90;
      tag_00._ptr = (char *)sVar4._len;
      tag_00._len._7_1_ = cVar5;
      mserialize::visit<binlog::ToStringVisitor,binlog::Range>
                (tag_00,in_stack_ffffffffffffff70,(Range *)sVar4._len);
      local_68 = (OstreamBuffer *)((long)&local_68->_out + 1);
    }
    else {
LAB_0027380c:
      detail::OstreamBuffer::put(this_00,in_stack_ffffffffffffff5f);
    }
    local_68 = (OstreamBuffer *)((long)&local_68->_out + 1);
  } while( true );
}

Assistant:

void PrettyPrinter::printEventMessage(detail::OstreamBuffer& out, const Event& event) const
{
  mserialize::string_view tags = event.source->argumentTags;
  Range args = event.arguments;
  ToStringVisitor visitor(out, this);

  const std::string& fmt = event.source->formatString;
  for (std::size_t i = 0; i < fmt.size(); ++i)
  {
    const char c = fmt[i];
    if (c == '{' && fmt[i+1] == '}')
    {
      const mserialize::string_view tag = mserialize::detail::tag_pop(tags);
      mserialize::visit(tag, visitor, args);
      ++i; // skip }
    }
    else
    {
      out.put(c);
    }
  }
}